

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

ps_seg_t * allphone_search_seg_iter(ps_search_t *search)

{
  long lVar1;
  phseg_iter_t *iter;
  allphone_search_t *allphs;
  ps_search_t *search_local;
  
  allphone_backtrace((allphone_search_t *)search,*(int *)&search[1].d2p + -1,(int32 *)0x0);
  lVar1._0_4_ = search[1].post;
  lVar1._4_4_ = search[1].n_words;
  if (lVar1 == 0) {
    search_local = (ps_search_t *)0x0;
  }
  else {
    search_local = (ps_search_t *)
                   __ckd_calloc__(1,0x40,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                  ,0x7a);
    search_local->vt = (ps_searchfuncs_t *)&fsg_segfuncs;
    search_local->type = (char *)search;
    search_local->d2p = *(dict2pid_t **)&search[1].post;
    allphone_search_fill_iter((ps_seg_t *)search_local,*(phseg_t **)search_local->d2p);
  }
  return (ps_seg_t *)search_local;
}

Assistant:

static ps_seg_t *
allphone_search_seg_iter(ps_search_t * search)
{
    allphone_search_t *allphs = (allphone_search_t *) search;
    phseg_iter_t *iter;

    allphone_backtrace(allphs, allphs->frame - 1, NULL);
    if (allphs->segments == NULL)
        return NULL;
    
    iter = ckd_calloc(1, sizeof(phseg_iter_t));

    iter->base.vt = &fsg_segfuncs;
    iter->base.search = search;
    iter->seg = allphs->segments;
    allphone_search_fill_iter((ps_seg_t *)iter, gnode_ptr(iter->seg));

    return (ps_seg_t *) iter;
}